

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecChoice.c
# Opt level: O2

Aig_Man_t * Cec_ComputeChoices(Gia_Man_t *pGia,Dch_Pars_t *pPars)

{
  Gia_Man_t *p;
  Aig_Man_t *pAVar1;
  abctime in_RDX;
  Cec_ParChc_t ParsChc;
  
  if (pPars->fVerbose != 0) {
    Abc_PrintTime(0x75731c,(char *)pPars->timeSynth,in_RDX);
  }
  Cec_ManChcSetDefaultParams(&ParsChc);
  ParsChc.nBTLimit = pPars->nBTLimit;
  ParsChc.fUseCSat = pPars->fUseCSat;
  if (100 < ParsChc.nBTLimit && ParsChc.fUseCSat != 0) {
    ParsChc.nBTLimit = 100;
  }
  ParsChc.fVerbose = pPars->fVerbose;
  p = Cec_ManChoiceComputationVec(pGia,3,&ParsChc);
  Gia_ManSetRegNum(p,p->nRegs);
  pAVar1 = Gia_ManToAig(p,1);
  Gia_ManStop(p);
  return pAVar1;
}

Assistant:

Aig_Man_t * Cec_ComputeChoices( Gia_Man_t * pGia, Dch_Pars_t * pPars )
{
    Cec_ParChc_t ParsChc, * pParsChc = &ParsChc;
    Aig_Man_t * pAig;
    if ( pPars->fVerbose )
        Abc_PrintTime( 1, "Synthesis time", pPars->timeSynth );
    Cec_ManChcSetDefaultParams( pParsChc );
    pParsChc->nBTLimit = pPars->nBTLimit;
    pParsChc->fUseCSat = pPars->fUseCSat;
    if ( pParsChc->fUseCSat && pParsChc->nBTLimit > 100 )
        pParsChc->nBTLimit = 100;
    pParsChc->fVerbose = pPars->fVerbose;
    pGia = Cec_ManChoiceComputationVec( pGia, 3, pParsChc );
    Gia_ManSetRegNum( pGia, Gia_ManRegNum(pGia) );
    pAig = Gia_ManToAig( pGia, 1 );
    Gia_ManStop( pGia );
    return pAig;
}